

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::RasterizationTests::init(RasterizationTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  undefined4 uVar3;
  RenderTarget target;
  int numSamples;
  Context *pCVar4;
  TestContext *testCtx;
  char *__s;
  int extraout_EAX;
  TestNode *pTVar5;
  BaseRenderingCase *pBVar6;
  long *plVar7;
  long lVar8;
  TestNode *pTVar9;
  LineInterpolationTest *pLVar10;
  long *plVar11;
  long lVar12;
  char *pcVar13;
  string name;
  allocator<char> local_c9;
  TestNode *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  char *local_80;
  TestNode *local_78;
  long *local_70 [2];
  long local_60 [2];
  TestNode *local_50;
  long local_48;
  long local_40;
  TestNode *local_38;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"primitives",
             "Primitive rasterization");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"triangles",
             "Render primitives as GL_TRIANGLES, verify rasterization result",RENDERTARGET_DEFAULT,
             -1,0x100);
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 4;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_00d1e738;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Render primitives as GL_TRIANGLE_STRIP, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 5;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_00d1e868;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Render primitives as GL_TRIANGLE_FAN, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 6;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_00d1e8d0;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"lines",
             "Render primitives as GL_LINES, verify rasterization result",RENDERTARGET_DEFAULT,-1,
             0x100);
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 1;
  *(undefined2 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_00d1e938;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"line_strip",
             "Render primitives as GL_LINE_STRIP, verify rasterization result",RENDERTARGET_DEFAULT,
             -1,0x100);
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined2 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_00d1ea08;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"line_loop",
             "Render primitives as GL_LINE_LOOP, verify rasterization result",RENDERTARGET_DEFAULT,
             -1,0x100);
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 2;
  *(undefined2 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_00d1ea70;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Render primitives as GL_LINES with wide lines, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0x100000001;
  *(undefined2 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_00d1e938;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0x100000003;
  *(undefined2 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_00d1ea08;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0x100000002;
  *(undefined2 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_00d1ea70;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xf0);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"points",
             "Render primitives as GL_POINTS, verify rasterization result",RENDERTARGET_DEFAULT,-1,
             0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PointCase_00d1ead8;
  *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 1;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
       0x3f800000;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fill_rules",
             "Primitive fill rules");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,pCVar4,"basic_quad","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  *(undefined8 *)&pBVar6->field_0xc4 = 0;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 2;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,pCVar4,"basic_quad_reverse","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  *(undefined8 *)&pBVar6->field_0xc4 = 1;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 2;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,pCVar4,"clipped_full","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x40);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  *(undefined8 *)&pBVar6->field_0xc4 = 2;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0xf;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,pCVar4,"clipped_partly","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x40);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  *(undefined8 *)&pBVar6->field_0xc4 = 3;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0xf;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,pCVar4,"projected","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_00d1eb38;
  *(undefined8 *)&pBVar6->field_0xc4 = 4;
  *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 2;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"culling",
             "Culling");
  local_38 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar12 = 0;
  local_50 = (TestNode *)this;
  do {
    local_78 = (TestNode *)(init::cullModes + lVar12);
    local_80 = init::cullModes[lVar12].prefix;
    lVar8 = 0;
    local_48 = lVar12;
    do {
      local_c8 = (TestNode *)(init::primitiveTypes + lVar8);
      lVar12 = 0;
      local_40 = lVar8;
      do {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_70,local_80,&local_c9);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_70);
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_90 = *plVar11;
          lStack_88 = plVar7[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar11;
          local_a0 = (long *)*plVar7;
        }
        local_98 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_b0 = *plVar11;
          lStack_a8 = plVar7[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar11;
          local_c0 = (long *)*plVar7;
        }
        local_b8 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        pBVar6 = (BaseRenderingCase *)operator_new(0xd0);
        GVar1 = *(GLenum *)&local_78->_vptr_TestNode;
        GVar2 = *(GLenum *)&local_c8->_vptr_TestNode;
        uVar3 = *(undefined4 *)((long)&init::frontOrders[0].mode + lVar12);
        anon_unknown_1::BaseRenderingCase::BaseRenderingCase
                  (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   (char *)local_c0,"Test primitive culling.",RENDERTARGET_DEFAULT,-1,0x100);
        (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BaseRenderingCase_00d1eb98;
        *(GLenum *)&pBVar6->field_0xc4 = GVar1;
        *(GLenum *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = GVar2;
        *(undefined4 *)
         ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar3;
        tcu::TestNode::addChild(local_38,(TestNode *)pBVar6);
        this = (RasterizationTests *)local_50;
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 == 0x10);
      lVar8 = local_40 + 1;
    } while (lVar8 != 3);
    lVar12 = local_48 + 1;
  } while (lVar12 != 3);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"interpolation",
             "Test interpolation");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,((TestNode *)this)->m_testCtx,"basic",
             "Non-projective interpolation");
  tcu::TestNode::addChild(pTVar5,pTVar9);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
  *(undefined4 *)&pBVar6->field_0xc4 = 4;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar6->m_flatshade = false;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
  *(undefined4 *)&pBVar6->field_0xc4 = 5;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar6->m_flatshade = false;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
  *(undefined4 *)&pBVar6->field_0xc4 = 6;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar6->m_flatshade = false;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar6);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,((TestNode *)this)->m_testCtx,"projected",
             "Projective interpolation");
  tcu::TestNode::addChild(pTVar5,pTVar9);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
  *(undefined4 *)&pBVar6->field_0xc4 = 4;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar6->m_flatshade = false;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
  *(undefined4 *)&pBVar6->field_0xc4 = 5;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar6->m_flatshade = false;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
  *(undefined4 *)&pBVar6->field_0xc4 = 6;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar6->m_flatshade = false;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar6);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar10);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"flatshading","Test flatshading")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle flatshading",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
  *(undefined4 *)&pBVar6->field_0xc4 = 4;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar6->m_flatshade = true;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip flatshading",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
  *(undefined4 *)&pBVar6->field_0xc4 = 5;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar6->m_flatshade = true;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan flatshading",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
  *(undefined4 *)&pBVar6->field_0xc4 = 6;
  *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar6->m_flatshade = true;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line flatshading",1,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip flatshading",3,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop flatshading",2,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line flatshading",1,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip flatshading",3,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1
            );
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar10);
  pLVar10 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop flatshading",2,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar10);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"fbo",
             "Test using framebuffer objects");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pcVar13 = (char *)0x0;
  local_78 = pTVar5;
  do {
    pTVar5 = local_78;
    local_c8 = (TestNode *)operator_new(0x70);
    testCtx = ((TestNode *)this)->m_testCtx;
    __s = *(char **)(pcVar13 + 0xd1e6d0);
    local_80 = pcVar13;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_c9);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0xb02fab);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_90 = *plVar11;
      lStack_88 = plVar7[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar11;
      local_a0 = (long *)*plVar7;
    }
    local_98 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_c0 = &local_b0;
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_b0 = *plVar11;
      lStack_a8 = plVar7[3];
    }
    else {
      local_b0 = *plVar11;
      local_c0 = (long *)*plVar7;
    }
    local_b8 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_c8,testCtx,__s,(char *)local_c0);
    pcVar13 = local_80;
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    pTVar9 = local_c8;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    tcu::TestNode::addChild(pTVar5,pTVar9);
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"primitives",
               "Primitive rasterization");
    tcu::TestNode::addChild(pTVar9,pTVar5);
    pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
    target = *(RenderTarget *)(pcVar13 + 0xd1e6d8);
    numSamples = *(int *)(pcVar13 + 0xd1e6dc);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
               "Render primitives as GL_TRIANGLES, verify rasterization result",target,numSamples,
               0x100);
    *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
    *(undefined4 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 4;
    *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__BaseRenderingCase_00d1e738;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pBVar6 = (BaseRenderingCase *)operator_new(0xf8);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
               "Render primitives as GL_LINES, verify rasterization result",target,numSamples,0x100)
    ;
    *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
    *(undefined8 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 1;
    *(undefined2 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1
    ;
    *(undefined4 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         0x3f800000;
    pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__BaseLineCase_00d1e938;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pBVar6 = (BaseRenderingCase *)operator_new(0xf8);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
               "Render primitives as GL_LINES with wide lines, verify rasterization result",target,
               numSamples,0x100);
    *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
    *(undefined8 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x100000001;
    *(undefined2 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1
    ;
    *(undefined4 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         0x3f800000;
    pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__BaseLineCase_00d1e938;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pBVar6 = (BaseRenderingCase *)operator_new(0xf0);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"points",
               "Render primitives as GL_POINTS, verify rasterization result",target,numSamples,0x100
              );
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__PointCase_00d1ead8;
    *(undefined8 *)&pBVar6->field_0xc4 = 0x300000000;
    *(undefined4 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 1;
    *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    *(undefined4 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
         0x3f800000;
    pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"fill_rules",
               "Primitive fill rules");
    tcu::TestNode::addChild(local_c8,pTVar5);
    pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,pCVar4,"basic_quad","Verify fill rules",target,numSamples,0x100);
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    *(undefined8 *)&pBVar6->field_0xc4 = 0;
    *(undefined4 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 2;
    *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,pCVar4,"basic_quad_reverse","Verify fill rules",target,numSamples,0x100);
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    *(undefined8 *)&pBVar6->field_0xc4 = 1;
    *(undefined4 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 2;
    *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,pCVar4,"clipped_full","Verify fill rules",target,numSamples,0x40);
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    *(undefined8 *)&pBVar6->field_0xc4 = 2;
    *(undefined4 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 0xf;
    *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,pCVar4,"clipped_partly","Verify fill rules",target,numSamples,0x40);
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    *(undefined8 *)&pBVar6->field_0xc4 = 3;
    *(undefined4 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 0xf;
    *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,pCVar4,"projected","Verify fill rules",target,numSamples,0x100);
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_00d1eb38;
    *(undefined8 *)&pBVar6->field_0xc4 = 4;
    *(undefined4 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 2;
    *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"interpolation",
               "Non-projective interpolation");
    tcu::TestNode::addChild(local_c8,pTVar5);
    pBVar6 = (BaseRenderingCase *)operator_new(0xd8);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
               "Verify triangle interpolation",target,numSamples,0x100);
    (pBVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TriangleInterpolationTest_00d1ebf8;
    *(undefined4 *)&pBVar6->field_0xc4 = 4;
    *(undefined1 *)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
    *(undefined8 *)
     ((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 3;
    *(undefined1 *)((long)&pBVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1
    ;
    pBVar6->m_flatshade = false;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
    pLVar10 = (LineInterpolationTest *)operator_new(0x148);
    anon_unknown_1::LineInterpolationTest::LineInterpolationTest
              (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
               "Verify line interpolation",1,0,PRIMITIVEWIDENESS_NARROW,target,numSamples);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar10);
    pLVar10 = (LineInterpolationTest *)operator_new(0x148);
    anon_unknown_1::LineInterpolationTest::LineInterpolationTest
              (pLVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
               "Verify wide line interpolation",1,0,PRIMITIVEWIDENESS_WIDE,target,numSamples);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar10);
    pcVar13 = local_80 + 0x10;
    this = (RasterizationTests *)local_50;
  } while (pcVar13 != (char *)0x40);
  return extraout_EAX;
}

Assistant:

void RasterizationTests::init (void)
{
	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");

		addChild(primitives);

		primitives->addChild(new TrianglesCase		(m_context, "triangles",		"Render primitives as GL_TRIANGLES, verify rasterization result"));
		primitives->addChild(new TriangleStripCase	(m_context, "triangle_strip",	"Render primitives as GL_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new TriangleFanCase	(m_context, "triangle_fan",		"Render primitives as GL_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new LinesCase			(m_context, "lines",			"Render primitives as GL_LINES, verify rasterization result",							PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineStripCase		(m_context, "line_strip",		"Render primitives as GL_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop",		"Render primitives as GL_LINE_LOOP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LinesCase			(m_context, "lines_wide",		"Render primitives as GL_LINES with wide lines, verify rasterization result",			PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineStripCase		(m_context, "line_strip_wide",	"Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop_wide",	"Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new PointCase			(m_context, "points",			"Render primitives as GL_POINTS, verify rasterization result",							PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

		addChild(fillRules);

		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			glw::GLenum	mode;
			const char*	prefix;
		} cullModes[] =
		{
			{ GL_FRONT,				"front_"	},
			{ GL_BACK,				"back_"		},
			{ GL_FRONT_AND_BACK,	"both_"		},
		};
		static const struct PrimitiveType
		{
			glw::GLenum	type;
			const char*	name;
		} primitiveTypes[] =
		{
			{ GL_TRIANGLES,			"triangles"			},
			{ GL_TRIANGLE_STRIP,	"triangle_strip"	},
			{ GL_TRIANGLE_FAN,		"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			glw::GLenum	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ GL_CCW,	""			},
			{ GL_CW,	"_reverse"	},
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(m_testCtx, "culling", "Culling");

		addChild(culling);

		for (int cullModeNdx   = 0; cullModeNdx   < DE_LENGTH_OF_ARRAY(cullModes);      ++cullModeNdx)
		for (int primitiveNdx  = 0; primitiveNdx  < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveNdx)
		for (int frontOrderNdx = 0; frontOrderNdx < DE_LENGTH_OF_ARRAY(frontOrders);    ++frontOrderNdx)
		{
			const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix;

			culling->addChild(new CullingTest(m_context, name.c_str(), "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode));
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Test interpolation");

		addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(m_testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(m_testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTest	(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTest		(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
		}
	}

	// .flatshading
	{
		tcu::TestCaseGroup* const flatshading = new tcu::TestCaseGroup(m_testCtx, "flatshading", "Test flatshading");

		addChild(flatshading);

		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle flatshading",			GL_TRIANGLES,		INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip flatshading",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan flatshading",		GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line flatshading",				GL_LINES,			INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip flatshading",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop flatshading",			GL_LINE_LOOP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line flatshading",			GL_LINES,			INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip flatshading",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop flatshading",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
	}

	// .fbo
	{
		static const struct
		{
			const char*						name;
			BaseRenderingCase::RenderTarget	target;
			int								numSamples;
		} renderTargets[] =
		{
			{ "texture_2d",				BaseRenderingCase::RENDERTARGET_TEXTURE_2D,			-1									},
			{ "rbo_singlesample",		BaseRenderingCase::RENDERTARGET_RBO_SINGLESAMPLE,	-1									},
			{ "rbo_multisample_4",		BaseRenderingCase::RENDERTARGET_RBO_MULTISAMPLE,	4									},
			{ "rbo_multisample_max",	BaseRenderingCase::RENDERTARGET_RBO_MULTISAMPLE,	BaseRenderingCase::SAMPLE_COUNT_MAX	},
		};

		tcu::TestCaseGroup* const fboGroup = new tcu::TestCaseGroup(m_testCtx, "fbo", "Test using framebuffer objects");
		addChild(fboGroup);

		// .texture_2d
		// .rbo_singlesample
		// .rbo_multisample_4
		// .rbo_multisample_max
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++targetNdx)
		{
			tcu::TestCaseGroup* const colorAttachmentGroup = new tcu::TestCaseGroup(m_testCtx, renderTargets[targetNdx].name, ("Test using " + std::string(renderTargets[targetNdx].name) + " color attachment").c_str());
			fboGroup->addChild(colorAttachmentGroup);

			// .primitives
			{
				tcu::TestCaseGroup* const primitiveGroup = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");
				colorAttachmentGroup->addChild(primitiveGroup);

				primitiveGroup->addChild(new TrianglesCase	(m_context, "triangles",	"Render primitives as GL_TRIANGLES, verify rasterization result",											renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new LinesCase		(m_context, "lines",		"Render primitives as GL_LINES, verify rasterization result",					PRIMITIVEWIDENESS_NARROW,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new LinesCase		(m_context, "lines_wide",	"Render primitives as GL_LINES with wide lines, verify rasterization result",	PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new PointCase		(m_context, "points",		"Render primitives as GL_POINTS, verify rasterization result",					PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}

			// .fill_rules
			{
				tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

				colorAttachmentGroup->addChild(fillRules);

				fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC,			renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}

			// .interpolation
			{
				tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Non-projective interpolation");

				colorAttachmentGroup->addChild(interpolation);

				interpolation->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE,								renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				interpolation->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				interpolation->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}
		}
	}
}